

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitCallIndirect(PrintExpressionContents *this,CallIndirect *curr)

{
  char *pcVar1;
  string_view str;
  string_view str_00;
  size_t sStack_20;
  
  if (curr->isReturn == true) {
    pcVar1 = "return_call_indirect ";
    sStack_20 = 0x15;
  }
  else {
    pcVar1 = "call_indirect ";
    sStack_20 = 0xe;
  }
  str._M_str = pcVar1;
  str._M_len = sStack_20;
  printMedium(this->o,str);
  if (((this->features).features & 0x100) != 0) {
    Name::print(&curr->table,this->o);
    std::operator<<(this->o,' ');
  }
  std::operator<<(this->o,'(');
  str_00._M_str = "type ";
  str_00._M_len = 5;
  printMinor(this->o,str_00);
  printHeapTypeName(this,(HeapType)(curr->heapType).id);
  std::operator<<(this->o,')');
  return;
}

Assistant:

void visitCallIndirect(CallIndirect* curr) {
    if (curr->isReturn) {
      printMedium(o, "return_call_indirect ");
    } else {
      printMedium(o, "call_indirect ");
    }

    if (features.hasReferenceTypes()) {
      curr->table.print(o);
      o << ' ';
    }

    o << '(';
    printMinor(o, "type ");

    printHeapTypeName(curr->heapType);

    o << ')';
  }